

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _tree.hpp
# Opt level: O0

void __thiscall
ft::
RBTree<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
::treeInit(RBTree<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
           *this)

{
  pointer ptVar1;
  undefined1 *this_00;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_f8;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_b0;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_58;
  RBTree<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *local_10;
  RBTree<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *this_local;
  
  this_00 = &this->field_0x20;
  local_10 = this;
  ptVar1 = allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::allocate((allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)this_00,1);
  this->NIL = ptVar1;
  ptVar1 = allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::allocate((allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)this_00,1);
  this->m_first = ptVar1;
  ptVar1 = allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::allocate((allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)this_00,1);
  this->m_last = ptVar1;
  ptVar1 = this->NIL;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::treeNode(&local_58,BLACK);
  allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::construct((allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)this_00,ptVar1,&local_58);
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~treeNode(&local_58);
  ptVar1 = this->m_first;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::treeNode(&local_b0,BLACK);
  allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::construct((allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&this->field_0x20,ptVar1,&local_b0);
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~treeNode(&local_b0);
  ptVar1 = this->m_last;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::treeNode(&local_f8,BLACK);
  allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::construct((allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&this->field_0x20,ptVar1,&local_f8);
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~treeNode(&local_f8);
  this->NIL->parent = this->NIL;
  this->NIL->left = this->NIL;
  this->NIL->right = this->NIL;
  this->m_first->left = this->NIL;
  this->m_first->right = this->NIL;
  this->m_last->left = this->NIL;
  this->m_last->right = this->NIL;
  this->m_root = this->NIL;
  return;
}

Assistant:

void treeInit() {
		this->NIL = this->m_alloc.allocate(1);
		this->m_first = this->m_alloc.allocate(1);
		this->m_last = this->m_alloc.allocate(1);

		this->m_alloc.construct(this->NIL, BLACK);
		this->m_alloc.construct(this->m_first, BLACK);
		this->m_alloc.construct(this->m_last, BLACK);

		this->NIL->parent = this->NIL;
		this->NIL->left = this->NIL;
		this->NIL->right = this->NIL;
		this->m_first->left = this->NIL;
		this->m_first->right = this->NIL;
		this->m_last->left = this->NIL;
		this->m_last->right = this->NIL;

		this->m_root = this->NIL;
	}